

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cc
# Opt level: O3

PointAttribute * __thiscall
draco::PointCloud::GetAttributeByUniqueId(PointCloud *this,uint32_t unique_id)

{
  pointer puVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  puVar1 = (this->attributes_).
           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(this->attributes_).
                super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar2 != 0) {
    lVar2 = lVar2 >> 3;
    lVar3 = 0;
    lVar4 = 0;
    while (*(uint32_t *)
            ((long)puVar1[lVar4]._M_t.
                   super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                   ._M_t + 0x3c) != unique_id) {
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x100000000;
      if (lVar2 + (ulong)(lVar2 == 0) == lVar4) {
        return (PointAttribute *)0x0;
      }
    }
    if ((int)lVar4 != -1) {
      return *(PointAttribute **)
              ((long)&(puVar1->_M_t).
                      super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                      ._M_t + (lVar3 >> 0x1d));
    }
  }
  return (PointAttribute *)0x0;
}

Assistant:

const PointAttribute *PointCloud::GetAttributeByUniqueId(
    uint32_t unique_id) const {
  const int32_t att_id = GetAttributeIdByUniqueId(unique_id);
  if (att_id == -1) {
    return nullptr;
  }
  return attributes_[att_id].get();
}